

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_Font::Dump(ON_Font *this,ON_TextLog *dump)

{
  uint uVar1;
  bool bVar2;
  Member MVar3;
  bool bVar4;
  Type TVar5;
  ON_Font *pOVar6;
  wchar_t *pwVar7;
  ON_SHA1_Hash *pOVar8;
  ON_FontMetrics *pOVar9;
  NameLocale name_locale;
  wchar_t *pwVar10;
  ON_wString s;
  ON_wString local_e0;
  ON_wString en_family_name;
  ON_wString en_windows_logfont_name;
  ON_wString en_postscript_name;
  ON_wString en_face_name;
  ON_wString windows_logfont_name;
  ON_wString quartet_description;
  ON_wString postscript_name;
  ON_wString face_name;
  ON_wString description;
  ON_wString rich_text_name;
  ON_FontFaceQuartet q;
  
  bVar2 = ON_TextLog::IsTextHash(dump);
  ON_wString::ON_wString(&s);
  if (bVar2) {
    ON_TextLog::Print(dump,L"Font family name = ...\n");
    ON_TextLog::PushIndent(dump);
    ON_TextLog::Print(dump,
                      L"The font face name and other properties depend on the platform \nor the fonts installed on a particular computer. Information like \nthis is omitted from dumps used for SHA-1 hash caluculations so \nhash values from different platforms and computers can be compared. \n"
                     );
    goto LAB_004a50d1;
  }
  Description((ON_Font *)&description);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&description);
  ON_TextLog::Print(dump,L"Font description = \"%ls\"\n",pwVar7);
  ON_TextLog::PushIndent(dump);
  FamilyName((ON_Font *)&q);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&q.m_quartet_name);
  ON_TextLog::Print(dump,L"Family name = \"%ls\"\n",pwVar7);
  name_locale = (NameLocale)this;
  FamilyName((ON_Font *)&en_family_name,name_locale);
  bVar4 = ON_wString::IsNotEmpty(&en_family_name);
  if ((bVar4) && (bVar4 = ::operator!=(&en_family_name,&q.m_quartet_name), bVar4)) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&en_family_name);
    ON_TextLog::Print(dump,L"Family name (English)= \"%ls\"\n",pwVar7);
  }
  FaceName((ON_Font *)&face_name);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&face_name);
  ON_TextLog::Print(dump,L"Face name = \"%ls\"\n",pwVar7);
  FaceName((ON_Font *)&en_face_name,name_locale);
  bVar4 = ON_wString::IsNotEmpty(&en_face_name);
  if ((bVar4) && (bVar4 = ::operator!=(&en_face_name,&face_name), bVar4)) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&en_face_name);
    ON_TextLog::Print(dump,L"Face name (English)= \"%ls\"\n",pwVar7);
  }
  PostScriptName((ON_Font *)&postscript_name);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&postscript_name);
  ON_TextLog::Print(dump,L"PostScript name = \"%ls\"\n",pwVar7);
  PostScriptName((ON_Font *)&en_postscript_name,name_locale);
  bVar4 = ON_wString::IsNotEmpty(&en_postscript_name);
  if ((bVar4) && (bVar4 = ::operator!=(&en_postscript_name,&postscript_name), bVar4)) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&en_postscript_name);
    ON_TextLog::Print(dump,L"PostScript name (English)= \"%ls\"\n",pwVar7);
  }
  QuartetDescription((ON_Font *)&quartet_description);
  bVar4 = ON_wString::IsNotEmpty(&quartet_description);
  if (bVar4) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&quartet_description);
    ON_TextLog::Print(dump,L"Quartet = %ls\n",pwVar7);
  }
  WindowsLogfontName((ON_Font *)&windows_logfont_name);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&windows_logfont_name);
  ON_TextLog::Print(dump,L"Windows LOGFONT name = \"%ls\"\n",pwVar7);
  WindowsLogfontName((ON_Font *)&en_windows_logfont_name,name_locale);
  bVar4 = ON_wString::IsNotEmpty(&en_windows_logfont_name);
  if ((bVar4) && (bVar4 = ::operator!=(&en_windows_logfont_name,&windows_logfont_name), bVar4)) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&en_windows_logfont_name);
    ON_TextLog::Print(dump,L"Windows LOGFONT name (English)= \"%ls\"\n",pwVar7);
  }
  RichTextFontName((ON_Font *)&rich_text_name,this,false);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&rich_text_name);
  ON_TextLog::Print(dump,L"Rich text name = \"%ls\"\n",pwVar7);
  if (((this->m_runtime_serial_number != 0) &&
      (((uint)this->m_managed_installed_font_and_bits & 3) == 2)) &&
     (pOVar6 = SubstituteFont(this), pOVar6 != (ON_Font *)0x0)) {
    Description((ON_Font *)&local_e0);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_e0);
    ON_TextLog::Print(dump,L"Installed substitute = %ls\n",pwVar7);
    ON_wString::~ON_wString(&local_e0);
  }
  ON_wString::operator=(&s,&ON_wString::EmptyString);
  switch(this->m_font_origin) {
  case Unset:
    goto switchD_004a4f30_caseD_0;
  case Unknown:
    pwVar7 = L"Unknown";
    break;
  case WindowsFont:
    pwVar7 = L"Windows Font";
    break;
  case AppleFont:
    pwVar7 = L"Apple Font";
    break;
  default:
    ON_wString::FormatToString((wchar_t *)&local_e0,L"%u");
    ON_wString::operator=(&s,&local_e0);
    ON_wString::~ON_wString(&local_e0);
    goto switchD_004a4f30_caseD_0;
  }
  ON_wString::operator=(&s,pwVar7);
switchD_004a4f30_caseD_0:
  bVar4 = ON_wString::IsNotEmpty(&s);
  if (bVar4) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
    ON_TextLog::Print(dump,L"Origin = %ls\n",pwVar7);
  }
  ON_wString::operator=(&s,&ON_wString::EmptyString);
  TVar5 = OutlineFigureType(this);
  switch(TVar5) {
  case Unset:
  case Unknown:
    goto switchD_004a4fd4_caseD_0;
  case SingleStroke:
    pwVar7 = L"Engraving - single stroke";
    break;
  case DoubleStroke:
    pwVar7 = L"Engraving - double stroke";
    break;
  case Perimeter:
    pwVar7 = L"Perimeter";
    break;
  case NotPerimeter:
    pwVar7 = L"Not a perimeter";
    break;
  default:
    ON_wString::FormatToString((wchar_t *)&local_e0,L"%u");
    ON_wString::operator=(&s,&local_e0);
    ON_wString::~ON_wString(&local_e0);
    goto switchD_004a4fd4_caseD_0;
  case Mixed:
    pwVar7 = L"Mixed";
  }
  ON_wString::operator=(&s,pwVar7);
switchD_004a4fd4_caseD_0:
  bVar4 = ON_wString::IsNotEmpty(&s);
  if (bVar4) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
    ON_TextLog::Print(dump,L"Outline type = %ls\n",pwVar7);
  }
  ON_wString::~ON_wString(&rich_text_name);
  ON_wString::~ON_wString(&en_windows_logfont_name);
  ON_wString::~ON_wString(&windows_logfont_name);
  ON_wString::~ON_wString(&quartet_description);
  ON_wString::~ON_wString(&en_postscript_name);
  ON_wString::~ON_wString(&postscript_name);
  ON_wString::~ON_wString(&en_face_name);
  ON_wString::~ON_wString(&face_name);
  ON_wString::~ON_wString(&en_family_name);
  ON_wString::~ON_wString(&q.m_quartet_name);
  ON_wString::~ON_wString(&description);
LAB_004a50d1:
  if ((this->m_point_size <= 0.0) || (10000000000.0 <= this->m_point_size)) {
    ON_TextLog::Print(dump,L"PointSize = annotation default\n");
  }
  else {
    ON_TextLog::Print(dump,L"PointSize = %g\n");
  }
  FontQuartet(&q,this);
  MVar3 = ON_FontFaceQuartet::QuartetMember(&q,this);
  switch(MVar3) {
  case Regular:
    ON_wString::ON_wString(&description,&q.m_quartet_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&description);
    ON_TextLog::Print(dump,"Quartet: %ls (Regular member)\n",pwVar7);
    break;
  case Bold:
    ON_wString::ON_wString(&description,&q.m_quartet_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&description);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold member)\n",pwVar7);
    break;
  case Italic:
    ON_wString::ON_wString(&description,&q.m_quartet_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&description);
    ON_TextLog::Print(dump,"Quartet: %ls (Italic member)\n",pwVar7);
    break;
  case BoldItalic:
    ON_wString::ON_wString(&description,&q.m_quartet_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&description);
    ON_TextLog::Print(dump,"Quartet: %ls (Bold-Italic member)\n",pwVar7);
    break;
  default:
    ON_TextLog::Print(dump,"Quartet: None\n");
    goto LAB_004a5237;
  }
  ON_wString::~ON_wString(&description);
LAB_004a5237:
  pwVar7 = WeightToWideString(this->m_font_weight);
  ON_wString::operator=(&s,pwVar7);
  bVar4 = ON_wString::IsEmpty(&s);
  if (bVar4) {
    ON_wString::FormatToString((wchar_t *)&description,L"%u",(ulong)this->m_font_weight);
    ON_wString::operator=(&s,&description);
    ON_wString::~ON_wString(&description);
  }
  if ((this->m_simulated & 2) != 0) {
    ON_wString::operator+=(&s,L" (simulated)");
  }
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
  ON_TextLog::Print(dump,L"Weight = %ls\n",pwVar7);
  pwVar7 = StretchToWideString(this->m_font_stretch);
  ON_wString::operator=(&s,pwVar7);
  bVar4 = ON_wString::IsEmpty(&s);
  if (bVar4) {
    ON_wString::FormatToString((wchar_t *)&description,L"%u",(ulong)this->m_font_stretch);
    ON_wString::operator=(&s,&description);
    ON_wString::~ON_wString(&description);
  }
  if ((this->m_simulated & 4) != 0) {
    ON_wString::operator+=(&s,L" (simulated)");
  }
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
  ON_TextLog::Print(dump,L"Stretch = %ls\n",pwVar7);
  pwVar7 = StyleToWideString(this->m_font_style);
  ON_wString::operator=(&s,pwVar7);
  bVar4 = ON_wString::IsEmpty(&s);
  if (bVar4) {
    ON_wString::FormatToString((wchar_t *)&description,L"%u",(ulong)this->m_font_style);
    ON_wString::operator=(&s,&description);
    ON_wString::~ON_wString(&description);
  }
  if ((this->m_simulated & 8) != 0) {
    ON_wString::operator+=(&s,L" (simulated)");
  }
  pwVar7 = ON_wString::operator_cast_to_wchar_t_(&s);
  ON_TextLog::Print(dump,L"Style = %ls\n",pwVar7);
  pwVar10 = L"false";
  pwVar7 = L"false";
  if (this->m_font_bUnderlined != false) {
    pwVar7 = L"true";
  }
  ON_TextLog::Print(dump,L"Underlined = %ls\n",pwVar7);
  pwVar7 = L"false";
  if (this->m_font_bStrikethrough != false) {
    pwVar7 = L"true";
  }
  ON_TextLog::Print(dump,L"Strikethrough = %ls\n",pwVar7);
  if (this->m_logfont_charset == '\x02') {
    pwVar10 = L"true";
  }
  ON_TextLog::Print(dump,L"Symbol font = %ls\n",pwVar10);
  TVar5 = OutlineFigureType(this);
  if (TVar5 == DoubleStroke) {
    pwVar7 = L"Engraving font = Double-stroke\n";
  }
  else {
    if (TVar5 != SingleStroke) goto LAB_004a5450;
    pwVar7 = L"Engraving font = Single-stroke\n";
  }
  ON_TextLog::Print(dump,pwVar7);
LAB_004a5450:
  if (NoFit < (this->m_panose1).m_family_kind) {
    ON_PANOSE1::Dump(&this->m_panose1,dump);
  }
  if (!bVar2) {
    pOVar8 = FontCharacteristicsHash(this);
    ON_SHA1_Hash::ToString((ON_SHA1_Hash *)&en_family_name,SUB81(pOVar8,0));
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&en_family_name);
    ON_TextLog::Print(dump,L"Font characteristics SHA-1 hash = %ls\n",pwVar7);
    uVar1 = this->m_runtime_serial_number;
    if (uVar1 != 0) {
      if (this == &Default) {
        pwVar7 = L"Managed font <%u> (ON_Font::Default)\n";
      }
      else {
        bVar2 = IsInstalledFont(this);
        pwVar7 = L"Managed font <%u> (face not installed on device)\n";
        if (bVar2) {
          pwVar7 = L"Managed font <%u> (face installed on device)\n";
        }
      }
      ON_TextLog::Print(dump,pwVar7,(ulong)uVar1);
      pOVar9 = FontUnitFontMetrics(this);
      description.m_s = *(wchar_t **)pOVar9;
      ON_TextLog::Print(dump,L"Font metrics:");
      bVar2 = ON_FontMetrics::IsSet((ON_FontMetrics *)&description);
      if (bVar2) {
        ON_TextLog::PrintNewLine(dump);
        ON_TextLog::PushIndent(dump);
        ON_FontMetrics::Dump((ON_FontMetrics *)&description,dump);
        ON_TextLog::PopIndent(dump);
      }
      else {
        ON_TextLog::Print(dump,L" Unset\n");
      }
    }
    ON_wString::~ON_wString(&en_family_name);
  }
  ON_TextLog::PopIndent(dump);
  ON_wString::~ON_wString(&q.m_quartet_name);
  ON_wString::~ON_wString(&s);
  return;
}

Assistant:

void ON_Font::Dump(ON_TextLog& dump) const
{
  const bool bTextHash = dump.IsTextHash();

  ON_wString s;

  if (bTextHash)
  {
    dump.Print(L"Font family name = ...\n");
    dump.PushIndent();
    dump.Print(
      L"The font face name and other properties depend on the platform \n"
      "or the fonts installed on a particular computer. Information like \n"
      "this is omitted from dumps used for SHA-1 hash caluculations so \n"
      "hash values from different platforms and computers can be compared. \n"
    );
  }
  else
  {
    const ON_wString description = Description();
    dump.Print(L"Font description = \"%ls\"\n", static_cast<const wchar_t*>( description ));
    dump.PushIndent();
    
    const ON_wString family_name = FamilyName();
    dump.Print(L"Family name = \"%ls\"\n", static_cast<const wchar_t*>(family_name ));
    const ON_wString en_family_name = FamilyName(ON_Font::NameLocale::English);
    if ( en_family_name.IsNotEmpty() && en_family_name != family_name)
      dump.Print(L"Family name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_family_name ));

    const ON_wString face_name = FaceName();
    dump.Print(L"Face name = \"%ls\"\n", static_cast<const wchar_t*>( face_name ));
    const ON_wString en_face_name = FaceName(ON_Font::NameLocale::English);
    if ( en_face_name.IsNotEmpty() && en_face_name != face_name)
      dump.Print(L"Face name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_face_name ));

    const ON_wString postscript_name = PostScriptName();
    dump.Print(L"PostScript name = \"%ls\"\n", static_cast<const wchar_t*>(postscript_name));
    const ON_wString en_postscript_name = PostScriptName(ON_Font::NameLocale::English);
    if ( en_postscript_name.IsNotEmpty() && en_postscript_name != postscript_name)
      dump.Print(L"PostScript name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_postscript_name ));

    const ON_wString quartet_description = this->QuartetDescription();
    if (quartet_description.IsNotEmpty())
      dump.Print(L"Quartet = %ls\n", static_cast<const wchar_t*>(quartet_description));

    const ON_wString windows_logfont_name = WindowsLogfontName();
    dump.Print(L"Windows LOGFONT name = \"%ls\"\n", static_cast<const wchar_t*>(windows_logfont_name));
    const ON_wString en_windows_logfont_name = WindowsLogfontName(ON_Font::NameLocale::English);
    if ( en_windows_logfont_name.IsNotEmpty() && en_windows_logfont_name != windows_logfont_name)
      dump.Print(L"Windows LOGFONT name (English)= \"%ls\"\n", static_cast<const wchar_t*>(en_windows_logfont_name ));

    const ON_wString rich_text_name = ON_Font::RichTextFontName(this, false);
    dump.Print(L"Rich text name = \"%ls\"\n", static_cast<const wchar_t*>(rich_text_name));

    if (this->IsManagedSubstitutedFont())
    {
      const ON_Font* substitute = this->SubstituteFont();
      if (nullptr != substitute)
        dump.Print(L"Installed substitute = %ls\n", static_cast<const wchar_t*>(substitute->Description()));
    }

    s = ON_wString::EmptyString;
    switch (this->FontOrigin())
    {
    case ON_Font::Origin::Unset: break;
    case ON_Font::Origin::Unknown: s = L"Unknown"; break;
    case ON_Font::Origin::WindowsFont: s = L"Windows Font"; break;
    case ON_Font::Origin::AppleFont: s = L"Apple Font";  break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontOrigin())); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Origin = %ls\n", static_cast<const wchar_t*>(s));
    }
       
    s = ON_wString::EmptyString;
    const ON_OutlineFigure::Type outline_figure_type = this->OutlineFigureType();
    switch (outline_figure_type)
    {
    case ON_OutlineFigure::Type::Unset: break;
    case ON_OutlineFigure::Type::Unknown: break;
    case ON_OutlineFigure::Type::SingleStroke: s = L"Engraving - single stroke"; break;
    case ON_OutlineFigure::Type::DoubleStroke: s = L"Engraving - double stroke"; break;
    case ON_OutlineFigure::Type::Perimeter: s = L"Perimeter"; break;
    case ON_OutlineFigure::Type::NotPerimeter: s = L"Not a perimeter"; break;
    case ON_OutlineFigure::Type::Mixed: s = L"Mixed"; break;
    default: s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(outline_figure_type)); break;
    };

    if (s.IsNotEmpty())
    {
      dump.Print(L"Outline type = %ls\n", static_cast<const wchar_t*>(s));
    }
  }

  if (ON_Font::IsValidPointSize(m_point_size))
  {
    dump.Print(L"PointSize = %g\n", m_point_size);
  }
  else
  {
    dump.Print(L"PointSize = annotation default\n");
  }

  const ON_FontFaceQuartet q = this->FontQuartet();
  const ON_FontFaceQuartet::Member m = q.QuartetMember(this);
  switch (m)
  {
  case ON_FontFaceQuartet::Member::Regular:
    dump.Print("Quartet: %ls (Regular member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Bold:
    dump.Print("Quartet: %ls (Bold member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Italic:
    dump.Print("Quartet: %ls (Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::BoldItalic:
    dump.Print("Quartet: %ls (Bold-Italic member)\n", static_cast<const wchar_t*>(q.QuartetName()));
    break;
  case ON_FontFaceQuartet::Member::Unset:
  default:
    dump.Print("Quartet: None\n");
    break;
  }


  s = ON_Font::WeightToWideString(FontWeight());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontWeight()));
  if (SimulatedWeight())
    s += L" (simulated)";
  dump.Print(L"Weight = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StretchToWideString(FontStretch());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStretch()));
  if (SimulatedStretch())
    s += L" (simulated)";
  dump.Print(L"Stretch = %ls\n", static_cast<const wchar_t*>(s));

  s = ON_Font::StyleToWideString(FontStyle());
  if( s.IsEmpty())
    s = ON_wString::FormatToString(L"%u", static_cast<unsigned int>(this->FontStyle()));
  if (SimulatedStyle())
    s += L" (simulated)";
  dump.Print(L"Style = %ls\n", static_cast<const wchar_t*>(s));

  dump.Print(L"Underlined = %ls\n", this->IsUnderlined() ? L"true" : L"false");

  dump.Print(L"Strikethrough = %ls\n", this->IsStrikethrough() ? L"true" : L"false");

  dump.Print(L"Symbol font = %ls\n", this->IsSymbolFont() ? L"true" : L"false");

  const ON_OutlineFigure::Type font_figure_type = this->OutlineFigureType();
  if (ON_OutlineFigure::Type::SingleStroke == font_figure_type)
    dump.Print(L"Engraving font = Single-stroke\n");
  else if (ON_OutlineFigure::Type::DoubleStroke == font_figure_type)
    dump.Print(L"Engraving font = Double-stroke\n");

  if ( 
    ON_PANOSE1::FamilyKind::Any != m_panose1.PANOSE1FamilyKind()
    && ON_PANOSE1::FamilyKind::NoFit != m_panose1.PANOSE1FamilyKind()
    )
  {
    // PANOSE1 may contains some useful information
    m_panose1.Dump(dump);
  }


  if (false == bTextHash)
  {
    const ON_wString characteristics_hash = FontCharacteristicsHash().ToString(true);
    dump.Print(L"Font characteristics SHA-1 hash = %ls\n", static_cast<const wchar_t*>(characteristics_hash));

    unsigned int runtime_sn = RuntimeSerialNumber();
    if (runtime_sn >= 1)
    {
      if (this == &ON_Font::Default)
        dump.Print(L"Managed font <%u> (ON_Font::Default)\n", runtime_sn);
      else if (IsInstalledFont())
      {
        dump.Print(L"Managed font <%u> (face installed on device)\n", runtime_sn);
      }
      else
      {
        dump.Print(L"Managed font <%u> (face not installed on device)\n", runtime_sn);
      }

      for (int fm_pass = 0; fm_pass < 1; fm_pass++)
      {
        const bool bNormalized = (1 == fm_pass);
        const ON_FontMetrics fm
          = bNormalized
          ? FontMetrics()
          : FontUnitFontMetrics();
        dump.Print(bNormalized ? L"Normalized font metrics:" : L"Font metrics:");
        if (fm.IsSet())
        {
          dump.PrintNewLine();
          dump.PushIndent();
          fm.Dump(dump);
          dump.PopIndent();
        }
        else
        {
          dump.Print(L" Unset\n");
        }
      }
    }

#if defined(ON_OS_WINDOWS_GDI)
    {
      const LOGFONT logfont = this->WindowsLogFont(0, nullptr);
      ON_Font::DumpLogfont(&logfont, dump);
    }
#elif defined (ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
    {
      bool bIsSubstituteFont = false;
      CTFontRef apple_font = AppleCTFont(bIsSubstituteFont);
      if (bIsSubstituteFont)
        dump.Print(L"Apple Core Text font (substitute):\n");
      else
        dump.Print(L"Apple Core Text font:\n");
      dump.PushIndent();
      ON_Font::DumpCTFont(apple_font, dump);
      dump.PopIndent();
      if (nullptr != apple_font && ON_Font::Origin::AppleFont == m_font_origin)
      {
        if (m_apple_font_weight_trait >= -1.0 && m_apple_font_weight_trait <= 1.0)
          dump.Print(L"Apple font weight trait = %g\n", m_apple_font_weight_trait);
        if (m_apple_font_width_trait >= -1.0 && m_apple_font_width_trait <= 1.0)
          dump.Print(L"Apple font width trait = %g\n", m_apple_font_width_trait);
      }
    }
#elif defined(OPENNURBS_FREETYPE_SUPPORT)
// Look in opennurbs_system_rumtime.h for the correct place to define OPENNURBS_FREETYPE_SUPPORT.
// Do NOT define OPENNURBS_FREETYPE_SUPPORT here or in your project setting ("makefile").
    if (runtime_sn >= 1)
    {
      // Free Type font details
      DumpFreeType(dump);
    }
#endif
  }
  dump.PopIndent();
}